

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlChar *pxVar1;
  xmlChar xVar2;
  xmlNsPtr pxVar3;
  int iVar4;
  xmlChar *in_RAX;
  ulong uVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam("searching namespaces stack (c14n)");
    uVar9 = 0;
  }
  else {
    pxVar8 = "";
    if (ns != (xmlNsPtr)0x0) {
      in_RAX = ns->prefix;
      pxVar8 = "";
      if (in_RAX != (xmlChar *)0x0) {
        pxVar8 = in_RAX;
      }
    }
    pxVar7 = "";
    if (ns != (xmlNsPtr)0x0) {
      in_RAX = ns->href;
      pxVar7 = "";
      if (in_RAX != (xmlChar *)0x0) {
        pxVar7 = in_RAX;
      }
    }
    if (*pxVar8 == '\0') {
      uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),*pxVar7 == '\0');
    }
    else {
      uVar5 = 0;
    }
    uVar9 = (uint)uVar5 & 0xff;
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      if ((uVar5 & 0xff) == 0) {
        lVar10 = (long)cur->nsPrevStart;
      }
      else {
        lVar10 = 0;
      }
      lVar12 = (long)cur->nsCurEnd;
      do {
        lVar11 = lVar12;
        iVar4 = (int)uVar5;
        if (lVar11 <= lVar10) break;
        pxVar3 = cur->nsTab[lVar11 + -1];
        if (pxVar3 == (xmlNsPtr)0x0) {
          pxVar6 = (xmlChar *)0x0;
        }
        else {
          pxVar6 = pxVar3->prefix;
        }
        if (pxVar8 == pxVar6) {
          bVar13 = true;
        }
        else {
          bVar13 = *pxVar8 == '\0';
          if (pxVar6 != (xmlChar *)0x0) {
            lVar12 = 0;
            do {
              pxVar1 = pxVar8 + lVar12;
              xVar2 = pxVar6[lVar12];
              bVar13 = *pxVar1 == xVar2;
              if (xVar2 == '\0') break;
              lVar12 = lVar12 + 1;
            } while (*pxVar1 == xVar2);
          }
        }
        if (bVar13) {
          if (pxVar3 == (xmlNsPtr)0x0) {
            pxVar6 = (xmlChar *)0x0;
          }
          else {
            pxVar6 = pxVar3->href;
          }
          if (pxVar7 == pxVar6) {
            bVar14 = true;
          }
          else if (pxVar6 == (xmlChar *)0x0) {
            bVar14 = *pxVar7 == '\0';
          }
          else {
            lVar12 = 0;
            do {
              pxVar1 = pxVar7 + lVar12;
              xVar2 = pxVar6[lVar12];
              bVar14 = *pxVar1 == xVar2;
              if (xVar2 == '\0') break;
              lVar12 = lVar12 + 1;
            } while (*pxVar1 == xVar2);
          }
          uVar5 = (ulong)bVar14;
        }
        iVar4 = (int)uVar5;
        lVar12 = lVar11 + -1;
      } while (!bVar13);
      if (lVar10 < lVar11) {
        return iVar4;
      }
    }
  }
  return uVar9;
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam("searching namespaces stack (c14n)");
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}